

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined8 uVar1;
  list_head *plVar2;
  JSValue v;
  JSValue v_00;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue obj_03;
  JSValue JVar3;
  undefined4 uVar4;
  int iVar5;
  BOOL BVar6;
  int *piVar7;
  int *piVar8;
  JSContext *in_RDI;
  JSValue JVar9;
  uint32_t hh;
  uint32_t ll;
  uint32_t count32;
  int h_present;
  int l_present;
  int64_t h;
  int64_t l;
  int64_t len;
  JSValue *arrp;
  JSValue hval;
  JSValue lval;
  JSValue obj;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  JSContext *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int64_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar10;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff5c;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  long local_88;
  long local_80;
  ulong local_78;
  JSContext *in_stack_ffffffffffffff90;
  JSValue in_stack_ffffffffffffff98;
  undefined4 local_10;
  undefined4 uStack_c;
  JSValue *local_8;
  
  uVar4 = uStack_c;
  uVar11 = 0;
  ctx_00 = (JSContext *)0x3;
  JVar9 = JS_ToObject(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  local_8 = (JSValue *)JVar9.tag;
  obj_02.tag._0_4_ = in_stack_ffffffffffffff30;
  obj_02.u = (JSValueUnion)in_stack_ffffffffffffff28;
  obj_02.tag._4_4_ = in_stack_ffffffffffffff34;
  iVar5 = js_get_length64((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                          ,(int64_t *)in_stack_ffffffffffffff18,obj_02);
  if (iVar5 == 0) {
    BVar6 = js_get_fast_array(in_RDI,JVar9,(JSValue **)&stack0xffffffffffffff90,
                              (uint32_t *)&stack0xffffffffffffff6c);
    local_10 = JVar9.u._0_4_;
    uStack_c = JVar9.u._4_4_;
    if ((BVar6 == 0) || (in_stack_ffffffffffffff6c != local_78)) {
      local_88 = local_78 - 1;
      for (local_80 = 0; local_80 < local_88; local_80 = local_80 + 1) {
        JVar9.u._4_4_ = in_stack_ffffffffffffff6c;
        JVar9.u.int32 = in_stack_ffffffffffffff68;
        JVar9.tag._0_4_ = in_stack_ffffffffffffff70;
        JVar9.tag._4_4_ = in_stack_ffffffffffffff74;
        in_stack_ffffffffffffff74 =
             JS_TryGetPropertyInt64(ctx_00,JVar9,CONCAT44(in_stack_ffffffffffffff5c,uVar11),local_8)
        ;
        if ((in_stack_ffffffffffffff74 < 0) ||
           (obj_03.u._4_4_ = in_stack_ffffffffffffff6c, obj_03.u.int32 = in_stack_ffffffffffffff68,
           obj_03.tag._0_4_ = in_stack_ffffffffffffff70,
           obj_03.tag._4_4_ = in_stack_ffffffffffffff74,
           in_stack_ffffffffffffff70 =
                JS_TryGetPropertyInt64
                          (ctx_00,obj_03,CONCAT44(in_stack_ffffffffffffff5c,uVar11),local_8),
           in_stack_ffffffffffffff70 < 0)) goto LAB_001b1521;
        if (in_stack_ffffffffffffff70 == 0) {
          if (in_stack_ffffffffffffff74 != 0) {
            obj_01.u._4_4_ = in_stack_ffffffffffffff24;
            obj_01.u.int32 = in_stack_ffffffffffffff20;
            obj_01.tag = in_stack_ffffffffffffff28;
            iVar5 = JS_DeletePropertyInt64
                              (in_stack_ffffffffffffff18,obj_01,
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff0c);
            if (iVar5 < 0) goto LAB_001b1521;
            this_obj_01.tag._0_4_ = in_stack_ffffffffffffff40;
            this_obj_01.u.ptr = (void *)in_stack_ffffffffffffff38;
            this_obj_01.tag._4_4_ = in_stack_ffffffffffffff44;
            val_01.tag._0_4_ = in_stack_ffffffffffffff30;
            val_01.u.ptr = (void *)in_stack_ffffffffffffff28;
            val_01.tag._4_4_ = in_stack_ffffffffffffff34;
            iVar5 = JS_SetPropertyInt64((JSContext *)
                                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ),this_obj_01,(int64_t)in_stack_ffffffffffffff18,
                                        val_01);
            if (iVar5 < 0) {
              in_stack_ffffffffffffff10 = 0;
              goto LAB_001b1521;
            }
            in_stack_ffffffffffffff00 = 0;
            in_stack_ffffffffffffff08 = 3;
            in_stack_ffffffffffffff0c = 0;
          }
        }
        else {
          this_obj.tag._0_4_ = in_stack_ffffffffffffff40;
          this_obj.u.ptr = (void *)in_stack_ffffffffffffff38;
          this_obj.tag._4_4_ = in_stack_ffffffffffffff44;
          val.tag._0_4_ = in_stack_ffffffffffffff30;
          val.u.ptr = (void *)in_stack_ffffffffffffff28;
          val.tag._4_4_ = in_stack_ffffffffffffff34;
          iVar5 = JS_SetPropertyInt64((JSContext *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                      this_obj,(int64_t)in_stack_ffffffffffffff18,val);
          if (iVar5 < 0) goto LAB_001b1521;
          if (in_stack_ffffffffffffff74 == 0) {
            obj_00.u._4_4_ = in_stack_ffffffffffffff24;
            obj_00.u.int32 = in_stack_ffffffffffffff20;
            obj_00.tag = in_stack_ffffffffffffff28;
            iVar5 = JS_DeletePropertyInt64
                              (in_stack_ffffffffffffff18,obj_00,
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                               in_stack_ffffffffffffff0c);
            if (iVar5 < 0) goto LAB_001b1521;
          }
          else {
            this_obj_00.tag._0_4_ = in_stack_ffffffffffffff40;
            this_obj_00.u.ptr = (void *)in_stack_ffffffffffffff38;
            this_obj_00.tag._4_4_ = in_stack_ffffffffffffff44;
            val_00.tag._0_4_ = in_stack_ffffffffffffff30;
            val_00.u.ptr = (void *)in_stack_ffffffffffffff28;
            val_00.tag._4_4_ = in_stack_ffffffffffffff34;
            iVar5 = JS_SetPropertyInt64((JSContext *)
                                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20
                                                ),this_obj_00,(int64_t)in_stack_ffffffffffffff18,
                                        val_00);
            if (iVar5 < 0) goto LAB_001b1521;
            in_stack_ffffffffffffff20 = 0;
            in_stack_ffffffffffffff28 = 3;
          }
        }
        local_88 = local_88 + -1;
      }
    }
    else if (1 < in_stack_ffffffffffffff6c) {
      for (uVar10 = 0; in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c - 1,
          uVar10 < in_stack_ffffffffffffff6c; uVar10 = uVar10 + 1) {
        piVar7 = &(in_stack_ffffffffffffff90->header).ref_count + (ulong)uVar10 * 4;
        uVar1 = *(undefined8 *)piVar7;
        plVar2 = ((list_head *)(piVar7 + 2))->prev;
        piVar7 = &(in_stack_ffffffffffffff90->header).ref_count + (ulong)uVar10 * 4;
        piVar8 = &(in_stack_ffffffffffffff90->header).ref_count +
                 (ulong)in_stack_ffffffffffffff6c * 4;
        *(undefined8 *)piVar7 = *(undefined8 *)piVar8;
        ((list_head *)(piVar7 + 2))->prev = ((list_head *)(piVar8 + 2))->prev;
        piVar7 = &(in_stack_ffffffffffffff90->header).ref_count +
                 (ulong)in_stack_ffffffffffffff6c * 4;
        *(undefined8 *)piVar7 = uVar1;
        ((list_head *)(piVar7 + 2))->prev = plVar2;
      }
    }
  }
  else {
LAB_001b1521:
    v.u._4_4_ = in_stack_ffffffffffffff0c;
    v.u.int32 = in_stack_ffffffffffffff08;
    v.tag._0_4_ = in_stack_ffffffffffffff10;
    v.tag._4_4_ = in_stack_ffffffffffffff14;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),v);
    v_00.u._4_4_ = in_stack_ffffffffffffff0c;
    v_00.u.int32 = in_stack_ffffffffffffff08;
    v_00.tag._0_4_ = in_stack_ffffffffffffff10;
    v_00.tag._4_4_ = in_stack_ffffffffffffff14;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),v_00);
    local_10 = 0;
    local_8 = (JSValue *)0x6;
    uStack_c = uVar4;
  }
  JVar3.u._4_4_ = uStack_c;
  JVar3.u.int32 = local_10;
  JVar3.tag = (int64_t)local_8;
  return JVar3;
}

Assistant:

static JSValue js_array_reverse(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, lval, hval;
    JSValue *arrp;
    int64_t len, l, h;
    int l_present, h_present;
    uint32_t count32;

    lval = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
        uint32_t ll, hh;

        if (count32 > 1) {
            for (ll = 0, hh = count32 - 1; ll < hh; ll++, hh--) {
                lval = arrp[ll];
                arrp[ll] = arrp[hh];
                arrp[hh] = lval;
            }
        }
        return obj;
    }

    for (l = 0, h = len - 1; l < h; l++, h--) {
        l_present = JS_TryGetPropertyInt64(ctx, obj, l, &lval);
        if (l_present < 0)
            goto exception;
        h_present = JS_TryGetPropertyInt64(ctx, obj, h, &hval);
        if (h_present < 0)
            goto exception;
        if (h_present) {
            if (JS_SetPropertyInt64(ctx, obj, l, hval) < 0)
                goto exception;

            if (l_present) {
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            } else {
                if (JS_DeletePropertyInt64(ctx, obj, h, JS_PROP_THROW) < 0)
                    goto exception;
            }
        } else {
            if (l_present) {
                if (JS_DeletePropertyInt64(ctx, obj, l, JS_PROP_THROW) < 0)
                    goto exception;
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            }
        }
    }
    return obj;

 exception:
    JS_FreeValue(ctx, lval);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}